

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_serialization.hpp
# Opt level: O2

pair<duckdb::AggregateFunction,_bool> * __thiscall
duckdb::FunctionSerializer::
DeserializeBase<duckdb::AggregateFunction,duckdb::AggregateFunctionCatalogEntry>
          (pair<duckdb::AggregateFunction,_bool> *__return_storage_ptr__,FunctionSerializer *this,
          Deserializer *deserializer,CatalogType catalog_type)

{
  bool bVar1;
  ClientContext *this_00;
  vector<duckdb::LogicalType,_true> original_arguments;
  vector<duckdb::LogicalType,_true> arguments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  AggregateFunction function;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1c8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1a8;
  undefined1 local_188 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  AggregateFunction local_150;
  
  this_00 = SerializationData::Get<duckdb::ClientContext&>((SerializationData *)(this + 0x10));
  Deserializer::ReadProperty<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_188 + 0x18)
             ,(Deserializer *)this,500,"name");
  Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
            ((vector<duckdb::LogicalType,_true> *)&local_1c8,(Deserializer *)this,0x1f5,"arguments")
  ;
  Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
            ((vector<duckdb::LogicalType,_true> *)&stack0xfffffffffffffe18,(Deserializer *)this,
             0x1f6,"original_arguments");
  local_188._0_8_ =
       local_1c8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_188._8_8_ =
       local_1c8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_188._16_8_ =
       local_1c8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1c8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DeserializeFunction<duckdb::AggregateFunction,duckdb::AggregateFunctionCatalogEntry>
            (&local_150,(FunctionSerializer *)this_00,(ClientContext *)((ulong)deserializer & 0xff),
             (char)local_188 + 0x18,(string *)local_188,
             (vector<duckdb::LogicalType,_true> *)&local_1a8,
             (vector<duckdb::LogicalType,_true> *)0x0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1a8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_188);
  bVar1 = Deserializer::ReadProperty<bool>((Deserializer *)this,0x1f7,"has_serialize");
  AggregateFunction::AggregateFunction(&__return_storage_ptr__->first,&local_150);
  __return_storage_ptr__->second = bVar1;
  AggregateFunction::~AggregateFunction(&local_150);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &stack0xfffffffffffffe18);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1c8);
  ::std::__cxx11::string::~string((string *)(local_188 + 0x18));
  return __return_storage_ptr__;
}

Assistant:

static pair<FUNC, bool> DeserializeBase(Deserializer &deserializer, CatalogType catalog_type) {
		auto &context = deserializer.Get<ClientContext &>();
		auto name = deserializer.ReadProperty<string>(500, "name");
		auto arguments = deserializer.ReadProperty<vector<LogicalType>>(501, "arguments");
		auto original_arguments = deserializer.ReadProperty<vector<LogicalType>>(502, "original_arguments");
		auto function = DeserializeFunction<FUNC, CATALOG_ENTRY>(context, catalog_type, name, std::move(arguments),
		                                                         std::move(original_arguments));
		auto has_serialize = deserializer.ReadProperty<bool>(503, "has_serialize");
		return make_pair(std::move(function), has_serialize);
	}